

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Approvals.h
# Opt level: O2

void ApprovalTests::
     TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>>::
     verifyAll<std::vector<Rectangle3,std::allocator<Rectangle3>>>
               (string *header,vector<Rectangle3,_std::allocator<Rectangle3>_> *list,
               function<void_(Rectangle3,_std::basic_ostream<char,_std::char_traits<char>_>_&)>
               *converter,Options *options)

{
  __normal_iterator<const_Rectangle3_*,_std::vector<Rectangle3,_std::allocator<Rectangle3>_>_>
  local_58;
  __normal_iterator<const_Rectangle3_*,_std::vector<Rectangle3,_std::allocator<Rectangle3>_>_>
  local_50;
  function<void_(const_Rectangle3_&,_std::basic_ostream<char,_std::char_traits<char>_>_&)> local_48;
  
  local_50._M_current =
       (list->super__Vector_base<Rectangle3,_std::allocator<Rectangle3>_>)._M_impl.
       super__Vector_impl_data._M_start;
  local_58._M_current =
       (list->super__Vector_base<Rectangle3,_std::allocator<Rectangle3>_>)._M_impl.
       super__Vector_impl_data._M_finish;
  ::std::function<void(Rectangle3_const&,std::ostream&)>::
  function<std::function<void(Rectangle3,std::ostream&)>&,void>
            ((function<void(Rectangle3_const&,std::ostream&)> *)&local_48,converter);
  TApprovals<ApprovalTests::ToStringCompileTimeOptions<ApprovalTests::StringMaker>_>::
  verifyAll<__gnu_cxx::__normal_iterator<const_Rectangle3_*,_std::vector<Rectangle3,_std::allocator<Rectangle3>_>_>_>
            (header,&local_50,&local_58,&local_48,options);
  ::std::_Function_base::~_Function_base(&local_48.super__Function_base);
  return;
}

Assistant:

static void verifyAll(
            const std::string& header,
            const Container& list,
            std::function<void(typename Container::value_type, std::ostream&)> converter,
            const Options& options = Options())
        {
            verifyAll<typename Container::const_iterator>(
                header, list.begin(), list.end(), converter, options);
        }